

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O3

BOOL __thiscall
Memory::Recycler::FinishConcurrent<(Memory::CollectionFlags)285736960>(Recycler *this)

{
  code *pcVar1;
  bool bVar2;
  CollectionState CVar3;
  int iVar4;
  undefined4 *puVar5;
  
  CVar3 = (this->collectionState).value;
  if (CVar3 != CollectionStateNotCollecting) {
    if (((this->enableConcurrentMark == false) && (this->enableParallelMark == false)) &&
       (this->enableConcurrentSweep == false)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x11fe,"(this->IsConcurrentEnabled())","this->IsConcurrentEnabled()");
      if (!bVar2) goto LAB_0071d4b5;
      *puVar5 = 0;
      CVar3 = (this->collectionState).value;
    }
    if ((CVar3 >> 0xd & 1) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x11ff,"(IsConcurrentState())","IsConcurrentState()");
      if (!bVar2) {
LAB_0071d4b5:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
      CVar3 = (this->collectionState).value;
    }
    if ((CVar3 >> 0xe & 1) == 0) {
      if ((CVar3 == CollectionStateConcurrentSweep) && (DAT_015bf420 != '\0')) {
        HeapInfoManager::ZeroQueuedPages(&this->autoHeap);
        HeapInfoManager::FlushBackgroundPages(&this->autoHeap);
      }
      (this->collectionParam).finishOnly = true;
      (this->collectionParam).flags = FinishConcurrentOnIdleAtRoot;
      this->isFinishGCOnIdle = true;
      this->allowDispose = false;
      this->skipStack = true;
      this->isConcurrentGCOnIdle = false;
      iVar4 = (*this->collectionWrapper->_vptr_RecyclerCollectionWrapper[9])
                        (this->collectionWrapper,this,FinishConcurrentCollect,0,0x11080000);
      return iVar4;
    }
  }
  return 0;
}

Assistant:

BOOL
Recycler::FinishConcurrent()
{
    CompileAssert((flags & ~(CollectOverride_AllowDispose | CollectOverride_ForceFinish | CollectOverride_ForceInThread
        | CollectMode_Concurrent | CollectOverride_DisableIdleFinish | CollectOverride_BackgroundFinishMark
        | CollectOverride_SkipStack | CollectOverride_FinishConcurrentTimeout)) == 0);

    if (this->CollectionInProgress())
    {
        Assert(this->IsConcurrentEnabled());
        Assert(IsConcurrentState());

        const BOOL forceFinish = flags & CollectOverride_ForceFinish;

        if (forceFinish || !IsConcurrentExecutingState())
        {
#if ENABLE_BACKGROUND_PAGE_FREEING
            if (CONFIG_FLAG(EnableBGFreeZero))
            {
                if (this->IsConcurrentSweepState())
                {
                    // Help with the background thread to zero and flush zero pages
                    // if we are going to wait anyways.
                    autoHeap.ZeroQueuedPages();
                    autoHeap.FlushBackgroundPages();
                }
            }
#endif
#ifdef RECYCLER_TRACE
            collectionParam.finishOnly = true;
            collectionParam.flags = flags;
#endif
#if ENABLE_CONCURRENT_GC
            // If SkipStack is provided, and we're not forcing the finish (i.e we're not in concurrent executing state)
            // then, it's fine to set the skipStack flag to true, so that during the in-thread find-roots, we'll skip
            // the stack scan
            this->skipStack = ((flags & CollectOverride_SkipStack) != 0) && !forceFinish;
#if DBG
            this->isFinishGCOnIdle = (flags == FinishConcurrentOnIdleAtRoot);
#endif
#endif

            return FinishConcurrentCollectWrapped(flags);
        }
    }

    return false;
}